

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RepeatLoopFixedGroupLastIterationInst::Exec
          (RepeatLoopFixedGroupLastIterationInst *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  Type TVar4;
  Label LVar5;
  LoopInfo *pLVar6;
  GroupInfo *pGVar7;
  PageAllocation *pPVar8;
  code *pcVar9;
  bool bVar10;
  uint uVar11;
  undefined4 *puVar12;
  char *pcVar13;
  Program *pPVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  
  uVar17 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  pPVar14 = (matcher->program).ptr;
  if ((ulong)(pPVar14->rep).insts.instsLen < uVar17 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                        "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar10) goto LAB_00efaa6e;
    *puVar12 = 0;
    pPVar14 = (matcher->program).ptr;
  }
  lVar16 = *(long *)&pPVar14->rep;
  if (*(char *)(lVar16 + uVar17) != 'N') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                        "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar10) goto LAB_00efaa6e;
    *puVar12 = 0;
    pPVar14 = (matcher->program).ptr;
    lVar16 = *(long *)&pPVar14->rep;
  }
  iVar2 = *(int *)(lVar16 + 1 + uVar17);
  lVar19 = (long)iVar2;
  if ((lVar19 < 0) || (pPVar14->numLoops <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                        "loopId >= 0 && loopId < program->numLoops");
    if (!bVar10) goto LAB_00efaa6e;
    *puVar12 = 0;
  }
  pLVar6 = (matcher->loopInfos).ptr;
  uVar11 = pLVar6[lVar19].number + 1;
  pLVar6[lVar19].number = uVar11;
  uVar18 = *(uint *)(lVar16 + 5 + uVar17);
  if (uVar11 < uVar18) {
    uVar18 = (this->super_RepeatLoopMixin).beginLabel + 0x1c;
    pPVar14 = (matcher->program).ptr;
    if (uVar18 < (pPVar14->rep).insts.instsLen) goto LAB_00efaa4f;
  }
  else {
    uVar3 = *(uint *)(lVar16 + 9 + uVar17);
    if ((uVar3 == 0xffffffff) || (uVar11 < uVar3)) {
      if (uVar11 == uVar18) {
        sVar15 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.bufferSize;
        if (sVar15 - (contStack->
                     super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                     super_ContinuousPageStack<1UL>.nextTop < 0x20) {
          ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
          sVar15 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>)
                   .super_ContinuousPageStack<1UL>.bufferSize;
        }
        if (sVar15 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                              ,199,"(bufferSize)","bufferSize");
          if (!bVar10) goto LAB_00efaa6e;
          *puVar12 = 0;
        }
        pPVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.pageAllocation;
        sVar15 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop = sVar15 + 0x20;
        *(size_t *)((long)&pPVar8[1].pageCount + sVar15) =
             (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             topElementSize;
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        topElementSize = 0x20;
        LVar5 = (this->super_RepeatLoopMixin).beginLabel;
        *(undefined1 *)((long)&pPVar8[2].pageCount + sVar15) = 10;
        *(undefined ***)((long)&pPVar8[1].segment + sVar15) = &PTR_Print_01543458;
        *(Label *)((long)&pPVar8[2].pageCount + sVar15 + 4) = LVar5;
        *(undefined1 *)((long)&pPVar8[2].segment + sVar15) = 1;
        Matcher::PushStats(matcher,contStack,input);
      }
      uVar18 = (this->super_RepeatLoopMixin).beginLabel + 0x1c;
      pPVar14 = (matcher->program).ptr;
    }
    else {
      if (uVar18 < uVar3) {
        pcVar13 = ContinuousPageStack<1UL>::Top
                            ((ContinuousPageStack<1UL> *)contStack,
                             (contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                             topElementSize);
        pcVar1 = pcVar13 + 8;
        if (pcVar13 == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                              ,0xe3b,"(top != 0)","top != 0");
          if (!bVar10) goto LAB_00efaa6e;
          *puVar12 = 0;
          pcVar1 = (char *)0x0;
        }
        if (pcVar1[8] != '\n') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                              ,0xe3c,
                              "(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration)",
                              "top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration");
          if (!bVar10) goto LAB_00efaa6e;
          *puVar12 = 0;
        }
        pcVar1[0x10] = '\0';
      }
      uVar18 = *(uint *)(lVar16 + 0x17 + uVar17);
      lVar19 = (long)(int)uVar18;
      if ((lVar19 < 0) || (pPVar14 = (matcher->program).ptr, pPVar14->numGroups <= uVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                            "groupId >= 0 && groupId < program->numGroups");
        if (!bVar10) goto LAB_00efaa6e;
        *puVar12 = 0;
        pPVar14 = (matcher->program).ptr;
      }
      pGVar7 = (matcher->groupInfos).ptr;
      TVar4 = *(Type *)(lVar16 + 0x13 + uVar17);
      pGVar7[lVar19].offset = *inputOffset - TVar4;
      pGVar7[lVar19].length = TVar4;
      uVar18 = *(uint *)(lVar16 + 0xf + uVar17);
    }
    if (uVar18 < (pPVar14->rep).insts.instsLen) goto LAB_00efaa4f;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar12 = 1;
  bVar10 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                      ,0x76d,"(label < program->rep.insts.instsLen)",
                      "label < program->rep.insts.instsLen");
  if (!bVar10) {
LAB_00efaa6e:
    pcVar9 = (code *)invalidInstructionException();
    (*pcVar9)();
  }
  *puVar12 = 0;
  pPVar14 = (matcher->program).ptr;
LAB_00efaa4f:
  *instPointer = (pPVar14->rep).insts.insts.ptr + uVar18;
  return false;
}

Assistant:

inline bool RepeatLoopFixedGroupLastIterationInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration);
                RewindLoopFixedGroupLastIterationCont* rewind = (RewindLoopFixedGroupLastIterationCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation

            // Bind group
            GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;

            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedGroupLastIterationCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        return false;
    }